

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

void __thiscall pbrt::MeasuredBRDF::MeasuredBRDF(MeasuredBRDF *this,Allocator alloc)

{
  PiecewiseLinear2D<3UL> *in_RSI;
  Allocator in_RDI;
  polymorphic_allocator<std::byte> *other;
  memory_resource *this_00;
  polymorphic_allocator<std::byte> local_50 [7];
  Allocator alloc_00;
  
  alloc_00.memoryResource = in_RDI.memoryResource;
  PiecewiseLinear2D<0UL>::PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)in_RSI,in_RDI);
  PiecewiseLinear2D<0UL>::PiecewiseLinear2D((PiecewiseLinear2D<0UL> *)in_RSI,alloc_00);
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)in_RSI,alloc_00);
  PiecewiseLinear2D<2UL>::PiecewiseLinear2D((PiecewiseLinear2D<2UL> *)in_RSI,alloc_00);
  this_00 = in_RDI.memoryResource + 0x50;
  PiecewiseLinear2D<3UL>::PiecewiseLinear2D(in_RSI,alloc_00);
  other = local_50;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)this_00,other);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             (in_RDI.memoryResource + 0x66),(polymorphic_allocator<float> *)other);
  std::__cxx11::string::string((string *)(in_RDI.memoryResource + 0x6b));
  return;
}

Assistant:

MeasuredBRDF(Allocator alloc)
        : ndf(alloc),
          sigma(alloc),
          vndf(alloc),
          luminance(alloc),
          spectra(alloc),
          wavelengths(alloc) {}